

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  uchar uVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint x_00;
  uint y_00;
  uint uVar6;
  uint uVar7;
  stbi_uc *psVar8;
  uchar *puVar9;
  stbi_uc *psVar10;
  stbi_uc *psVar11;
  uchar *puVar12;
  byte bVar13;
  uint uVar14;
  stbi_uc *psVar15;
  int iVar16;
  byte bVar17;
  uint *puVar18;
  int iVar19;
  byte bVar20;
  ulong __n;
  byte bVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  uchar raw_data [4];
  uint local_94;
  uint local_90;
  byte local_5c [4];
  stbi_uc *local_58;
  uint *local_50;
  stbi_uc *local_48;
  uint local_3c;
  ulong local_38;
  
  psVar8 = s->img_buffer;
  psVar10 = s->img_buffer_end;
  if (psVar8 < psVar10) {
    s->img_buffer = psVar8 + 1;
    local_94 = (uint)*psVar8;
    psVar8 = psVar8 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    local_94 = 0;
  }
  else {
    psVar8 = s->buffer_start;
    iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar8,s->buflen);
    if (iVar4 == 0) {
      s->read_from_callbacks = 0;
      psVar10 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      local_94 = 0;
    }
    else {
      psVar10 = psVar8 + iVar4;
      local_94 = (uint)*psVar8;
    }
    s->img_buffer_end = psVar10;
    psVar8 = s->buffer_start + 1;
    s->img_buffer = psVar8;
  }
  if (psVar8 < psVar10) {
    s->img_buffer = psVar8 + 1;
    bVar21 = *psVar8;
    psVar8 = psVar8 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    bVar21 = 0;
  }
  else {
    psVar8 = s->buffer_start;
    iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar8,s->buflen);
    if (iVar4 == 0) {
      s->read_from_callbacks = 0;
      psVar10 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar21 = 0;
    }
    else {
      psVar10 = psVar8 + iVar4;
      bVar21 = *psVar8;
    }
    s->img_buffer_end = psVar10;
    psVar8 = s->buffer_start + 1;
    s->img_buffer = psVar8;
  }
  local_3c = req_comp;
  if (psVar8 < psVar10) {
    s->img_buffer = psVar8 + 1;
    bVar17 = *psVar8;
  }
  else if (s->read_from_callbacks == 0) {
    bVar17 = 0;
  }
  else {
    psVar10 = s->buffer_start;
    iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
    if (iVar4 == 0) {
      s->read_from_callbacks = 0;
      psVar8 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar17 = 0;
    }
    else {
      psVar8 = psVar10 + iVar4;
      bVar17 = *psVar10;
    }
    s->img_buffer_end = psVar8;
    s->img_buffer = s->buffer_start + 1;
  }
  iVar4 = stbi__get16le(s);
  local_58 = (stbi_uc *)CONCAT44(local_58._4_4_,iVar4);
  uVar5 = stbi__get16le(s);
  pbVar2 = s->img_buffer;
  if (pbVar2 < s->img_buffer_end) {
    s->img_buffer = pbVar2 + 1;
    local_90 = (uint)*pbVar2;
  }
  else if (s->read_from_callbacks == 0) {
    local_90 = 0;
  }
  else {
    psVar10 = s->buffer_start;
    iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
    if (iVar4 == 0) {
      s->read_from_callbacks = 0;
      psVar8 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      local_90 = 0;
    }
    else {
      psVar8 = psVar10 + iVar4;
      local_90 = (uint)*psVar10;
    }
    s->img_buffer_end = psVar8;
    s->img_buffer = s->buffer_start + 1;
  }
  stbi__get16le(s);
  stbi__get16le(s);
  x_00 = stbi__get16le(s);
  y_00 = stbi__get16le(s);
  psVar8 = s->img_buffer;
  psVar10 = s->img_buffer_end;
  local_50 = (uint *)x;
  if (psVar8 < psVar10) {
    s->img_buffer = psVar8 + 1;
    bVar20 = *psVar8;
    psVar8 = psVar8 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    bVar20 = 0;
  }
  else {
    psVar8 = s->buffer_start;
    iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar8,s->buflen);
    if (iVar4 == 0) {
      s->read_from_callbacks = 0;
      psVar10 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar20 = 0;
    }
    else {
      psVar10 = psVar8 + iVar4;
      bVar20 = *psVar8;
    }
    s->img_buffer_end = psVar10;
    psVar8 = s->buffer_start + 1;
    s->img_buffer = psVar8;
  }
  if (psVar8 < psVar10) {
    s->img_buffer = psVar8 + 1;
    bVar13 = *psVar8;
  }
  else if (s->read_from_callbacks == 0) {
    bVar13 = 0;
  }
  else {
    psVar10 = s->buffer_start;
    iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
    if (iVar4 == 0) {
      s->read_from_callbacks = 0;
      psVar8 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar13 = 0;
    }
    else {
      psVar8 = psVar10 + iVar4;
      bVar13 = *psVar10;
    }
    s->img_buffer_end = psVar8;
    s->img_buffer = s->buffer_start + 1;
  }
  uVar6 = bVar17 - 8;
  if (bVar17 < 8) {
    uVar6 = (uint)bVar17;
  }
  if (x_00 == 0) {
    return (stbi_uc *)0x0;
  }
  if (y_00 == 0) {
    return (stbi_uc *)0x0;
  }
  if (uVar6 - 4 < 0xfffffffd) {
    return (stbi_uc *)0x0;
  }
  if (3 < (byte)(bVar20 * ' ' | (byte)(bVar20 - 8) >> 3)) {
    return (stbi_uc *)0x0;
  }
  uVar14 = (uint)(bVar20 >> 3);
  uVar6 = local_90 >> 3;
  if (bVar21 == 0) {
    uVar6 = uVar14;
  }
  local_38 = (ulong)uVar6;
  *local_50 = x_00;
  *y = y_00;
  if (comp != (int *)0x0) {
    *comp = uVar6;
  }
  local_50 = (uint *)(ulong)(y_00 * x_00);
  puVar9 = (uchar *)malloc(local_38 * (long)local_50);
  if (puVar9 != (uchar *)0x0) {
    stbi__skip(s,local_94);
    if ((bVar21 == 0) && (bVar17 < 8)) {
      uVar23 = 0;
      uVar5 = y_00;
      do {
        uVar5 = uVar5 - 1;
        uVar7 = uVar23;
        if ((bVar13 >> 5 & 1) == 0) {
          uVar7 = uVar5;
        }
        stbi__getn(s,puVar9 + (int)(uVar7 * uVar14 * x_00),uVar14 * x_00);
        uVar23 = uVar23 + 1;
      } while (uVar5 != 0);
    }
    else {
      if (bVar21 == 0) {
        local_48 = (stbi_uc *)0x0;
      }
      else {
        stbi__skip(s,(int)local_58);
        uVar23 = local_90 * uVar5 >> 3;
        psVar10 = (stbi_uc *)malloc((ulong)uVar23);
        if (psVar10 == (stbi_uc *)0x0) {
          free(puVar9);
          goto LAB_00112c69;
        }
        iVar4 = stbi__getn(s,psVar10,uVar23);
        local_48 = psVar10;
        if (iVar4 == 0) {
          free(puVar9);
          free(psVar10);
          stbi__g_failure_reason = "bad palette";
          return (stbi_uc *)0x0;
        }
      }
      psVar10 = s->buffer_start;
      psVar8 = s->buffer_start + 1;
      __n = (ulong)((bVar20 - 1 >> 3) + 1);
      bVar26 = true;
      uVar24 = 0;
      local_94 = 0;
      iVar4 = 0;
      local_58 = psVar10;
      do {
        if (bVar17 < 8) {
LAB_001129fc:
          if (bVar21 == 0) {
            if (bVar20 != 0) {
              psVar15 = s->img_buffer;
              psVar11 = s->img_buffer_end;
              uVar22 = 0;
              do {
                if (psVar15 < psVar11) {
                  s->img_buffer = psVar15 + 1;
                  bVar3 = *psVar15;
                  psVar15 = psVar15 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar3 = 0;
                }
                else {
                  iVar16 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
                  if (iVar16 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar3 = 0;
                    psVar11 = psVar8;
                  }
                  else {
                    bVar3 = *psVar10;
                    psVar11 = psVar10 + iVar16;
                  }
                  s->img_buffer_end = psVar11;
                  s->img_buffer = psVar8;
                  psVar15 = psVar8;
                }
                local_5c[uVar22] = bVar3;
                uVar22 = uVar22 + 1;
              } while (__n != uVar22);
            }
          }
          else {
            pbVar2 = s->img_buffer;
            if (pbVar2 < s->img_buffer_end) {
              s->img_buffer = pbVar2 + 1;
              bVar3 = *pbVar2;
            }
            else if (s->read_from_callbacks == 0) {
              bVar3 = 0;
            }
            else {
              iVar16 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
              if (iVar16 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                bVar3 = 0;
                psVar15 = psVar8;
              }
              else {
                bVar3 = *psVar10;
                psVar15 = psVar10 + iVar16;
              }
              s->img_buffer_end = psVar15;
              s->img_buffer = psVar8;
            }
            if (bVar20 != 0) {
              uVar23 = (uint)bVar3;
              if (uVar5 <= bVar3) {
                uVar23 = 0;
              }
              memcpy(local_5c,local_48 + uVar23 * uVar14,__n);
              psVar10 = local_58;
            }
          }
        }
        else {
          if (iVar4 == 0) {
            pbVar2 = s->img_buffer;
            if (pbVar2 < s->img_buffer_end) {
              s->img_buffer = pbVar2 + 1;
              bVar3 = *pbVar2;
            }
            else if (s->read_from_callbacks == 0) {
              bVar3 = 0;
            }
            else {
              iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
              if (iVar4 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                bVar3 = 0;
                psVar15 = psVar8;
              }
              else {
                bVar3 = *psVar10;
                psVar15 = psVar10 + iVar4;
              }
              s->img_buffer_end = psVar15;
              s->img_buffer = psVar8;
            }
            iVar4 = (bVar3 & 0x7f) + 1;
            local_94 = (uint)(bVar3 >> 7);
            goto LAB_001129fc;
          }
          bVar25 = local_94 != 0;
          local_94 = 1;
          if (!bVar25 || bVar26) {
            local_94 = (uint)bVar25;
            goto LAB_001129fc;
          }
        }
        if (uVar6 != 0) {
          memcpy(puVar9 + uVar6 * (int)uVar24,local_5c,local_38);
          psVar10 = local_58;
        }
        iVar4 = iVar4 + -1;
        uVar24 = uVar24 + 1;
        bVar26 = false;
      } while ((uint *)uVar24 != local_50);
      if ((bVar13 >> 5 & 1) == 0) {
        iVar4 = x_00 * uVar6;
        iVar16 = iVar4 * (y_00 - 1);
        uVar14 = 0;
        uVar5 = 0;
        do {
          if (iVar4 != 0) {
            puVar12 = puVar9;
            iVar19 = iVar4 + 1;
            do {
              uVar1 = puVar12[uVar14];
              puVar12[uVar14] = puVar12[iVar16];
              puVar12[iVar16] = uVar1;
              puVar12 = puVar12 + 1;
              iVar19 = iVar19 + -1;
            } while (1 < iVar19);
          }
          iVar16 = iVar16 - iVar4;
          uVar14 = uVar14 + iVar4;
          bVar26 = uVar5 != y_00 - 1 >> 1;
          uVar5 = uVar5 + 1;
        } while (bVar26);
      }
      if (local_48 != (stbi_uc *)0x0) {
        free(local_48);
      }
    }
    if ((int)local_50 != 0 && 2 < uVar6) {
      puVar12 = puVar9 + 2;
      puVar18 = local_50;
      do {
        uVar1 = puVar12[-2];
        puVar12[-2] = *puVar12;
        *puVar12 = uVar1;
        puVar12 = puVar12 + local_38;
        uVar5 = (int)puVar18 - 1;
        puVar18 = (uint *)(ulong)uVar5;
      } while (uVar5 != 0);
    }
    if (local_3c != 0) {
      if (uVar6 != local_3c) {
        puVar9 = stbi__convert_format(puVar9,uVar6,local_3c,x_00,y_00);
        return puVar9;
      }
      return puVar9;
    }
    return puVar9;
  }
LAB_00112c69:
  stbi__g_failure_reason = "outofmem";
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp = tga_bits_per_pixel / 8;
   int tga_inverted = stbi__get8(s);
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4];
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   /* int tga_alpha_bits = tga_inverted & 15; */
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   error check
   if ( //(tga_indexed) ||
      (tga_width < 1) || (tga_height < 1) ||
      (tga_image_type < 1) || (tga_image_type > 3) ||
      ((tga_bits_per_pixel != 8) && (tga_bits_per_pixel != 16) &&
      (tga_bits_per_pixel != 24) && (tga_bits_per_pixel != 32))
      )
   {
      return NULL; // we don't report this as a bad TGA because we don't even know if it's TGA
   }

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed )
   {
      tga_comp = tga_palette_bits / 8;
   }

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   tga_data = (unsigned char*)stbi__malloc( (size_t)tga_width * tga_height * tga_comp );
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE) {
      for (i=0; i < tga_height; ++i) {
         int y = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + y*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc( tga_palette_len * tga_palette_bits / 8 );
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (!stbi__getn(s, tga_palette, tga_palette_len * tga_palette_bits / 8 )) {
            STBI_FREE(tga_data);
            STBI_FREE(tga_palette);
            return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               //   read in 1 byte, then perform the lookup
               int pal_idx = stbi__get8(s);
               if ( pal_idx >= tga_palette_len )
               {
                  //   invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_bits_per_pixel / 8;
               for (j = 0; j*8 < tga_bits_per_pixel; ++j)
               {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else
            {
               //   read in the data raw
               for (j = 0; j*8 < tga_bits_per_pixel; ++j)
               {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB
   if (tga_comp >= 3)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   //   OK, done
   return tga_data;
}